

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O3

bool __thiscall V4L2Device::open_device(V4L2Device *this)

{
  Options *this_00;
  int iVar1;
  Writer *pWVar2;
  OptionDetails *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  undefined1 *puVar7;
  Writer local_88;
  
  if (this->fd == -1) {
    this_00 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_88._vptr_Writer = (_func_int **)&local_88.m_file;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"device","");
    this_01 = cxxopts::Options::operator[](this_00,(string *)&local_88);
    pbVar3 = cxxopts::OptionDetails::as<std::__cxx11::string>(this_01);
    pcVar6 = (pbVar3->_M_dataplus)._M_p;
    if (local_88._vptr_Writer != (_func_int **)&local_88.m_file) {
      operator_delete(local_88._vptr_Writer);
    }
    iVar1 = open(pcVar6,2);
    this->fd = iVar1;
    if (-1 < iVar1) {
      return true;
    }
    local_88._vptr_Writer = (_func_int **)&PTR__Writer_00162088;
    local_88.m_level = Error;
    local_88.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_88.m_line = 0x11f;
    local_88.m_func = "bool V4L2Device::open_device()";
    local_88.m_verboseLevel = 0;
    local_88.m_logger = (Logger *)0x0;
    local_88.m_proceed = false;
    local_88.m_messageBuilder.m_logger = (Logger *)0x0;
    local_88.m_messageBuilder.m_containerLogSeperator = "";
    local_88.m_dispatchAction = NormalLog;
    local_88.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_88,1,"default");
    if ((pWVar2->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50,"Couldn\'t open \'"
                   ,0xf), (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
    if (pWVar2->m_proceed == true) {
      puVar7 = &((pWVar2->m_messageBuilder).m_logger)->field_0x50;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)puVar7 + (int)*(undefined8 *)(*(long *)puVar7 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar7,pcVar6,sVar4);
      }
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    if ((pWVar2->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50,"\': ",3),
       (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    if (pWVar2->m_proceed == true) {
      puVar7 = &((pWVar2->m_messageBuilder).m_logger)->field_0x50;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)puVar7 + (int)*(undefined8 *)(*(long *)puVar7 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar7,pcVar6,sVar4);
      }
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
  }
  else {
    local_88._vptr_Writer = (_func_int **)&PTR__Writer_00162088;
    local_88.m_level = Warning;
    local_88.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_88.m_line = 0x123;
    local_88.m_func = "bool V4L2Device::open_device()";
    local_88.m_verboseLevel = 0;
    local_88.m_logger = (Logger *)0x0;
    local_88.m_proceed = false;
    local_88.m_messageBuilder.m_logger = (Logger *)0x0;
    local_88.m_messageBuilder.m_containerLogSeperator = "";
    local_88.m_dispatchAction = NormalLog;
    local_88.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_88,1,"default");
    if ((pWVar2->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50,
                   "Is device already initialized?",0x1e),
       (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
  }
  el::base::Writer::~Writer(&local_88);
  return false;
}

Assistant:

bool
    open_device()
    {
        if (fd == -1) {
            auto device = (*options)["device"].as<std::string>().c_str();
            fd = open(device, O_RDWR);
            if (fd < 0) {
                LOG(ERROR) << "Couldn't open '" << device << "': " << strerror(errno);
                return false;
            }
        } else {
            LOG(WARNING) << "Is device already initialized?";
            return false;
        }

        return true;
    }